

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorArrayList_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint columns,GLuint size)

{
  GLuint column;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (columns != 0) {
    column = 0;
    do {
      getVectorInitializer_abi_cxx11_(&local_50,this,column,size);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      column = column + 1;
      if (column < columns) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    } while (columns != column);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorArrayList(GLuint columns, GLuint size)
{
	std::string result;

	for (GLuint col = 0; col < columns; ++col)
	{
		result.append(getVectorInitializer(col, size));

		if (col + 1 < columns)
		{
			result.append(", ");
		}
	}

	return result;
}